

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1ba5289::OriginPubkeyProvider::ToNormalizedString
          (OriginPubkeyProvider *this,SigningProvider *arg,string *ret,DescriptorCache *cache)

{
  uint uVar1;
  pointer pPVar2;
  reference pvVar3;
  undefined8 in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  string sub;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  size_type in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  char *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  StringType type;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  bool local_129;
  char local_48 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_28;
  this_01 = in_RDI;
  std::__cxx11::string::string(in_stack_fffffffffffffe80);
  pPVar2 = std::
           unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
           ::operator->((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                         *)in_stack_fffffffffffffe68);
  uVar1 = (*pPVar2->_vptr_PubkeyProvider[7])(pPVar2,in_RSI,this_00,in_RCX);
  type = CONCAT13((char)uVar1,(int3)in_stack_fffffffffffffe9c);
  if ((uVar1 & 1) == 0) {
    local_129 = false;
  }
  else {
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                        in_stack_fffffffffffffe70);
    if (*pvVar3 == '[') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (this_00,(size_type)in_RDI,(size_type)in_stack_fffffffffffffe80);
      __lhs = local_48;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this_01,in_RSI);
      std::__cxx11::string::~string(in_stack_fffffffffffffe68);
      (anonymous_namespace)::OriginPubkeyProvider::OriginString_abi_cxx11_
                ((OriginPubkeyProvider *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),type,
                 SUB41((uint)in_stack_fffffffffffffe98 >> 0x18,0));
      std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(type,in_stack_fffffffffffffe98));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this_01,in_RSI);
      std::__cxx11::string::~string(in_stack_fffffffffffffe68);
      std::__cxx11::string::~string(in_stack_fffffffffffffe68);
      std::__cxx11::string::~string(in_stack_fffffffffffffe68);
    }
    else {
      (anonymous_namespace)::OriginPubkeyProvider::OriginString_abi_cxx11_
                ((OriginPubkeyProvider *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),type,
                 SUB41((uint)in_stack_fffffffffffffe98 >> 0x18,0));
      std::operator+((char *)in_stack_fffffffffffffe80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      std::operator+(in_stack_fffffffffffffe80,
                     (char *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(type,in_stack_fffffffffffffe98));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this_01,in_RSI);
      std::__cxx11::string::~string(in_stack_fffffffffffffe68);
      std::__cxx11::string::~string(in_stack_fffffffffffffe68);
      std::__cxx11::string::~string(in_stack_fffffffffffffe68);
      std::__cxx11::string::~string(in_stack_fffffffffffffe68);
    }
    local_129 = true;
  }
  std::__cxx11::string::~string(in_stack_fffffffffffffe68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_129;
  }
  __stack_chk_fail();
}

Assistant:

bool ToNormalizedString(const SigningProvider& arg, std::string& ret, const DescriptorCache* cache) const override
    {
        std::string sub;
        if (!m_provider->ToNormalizedString(arg, sub, cache)) return false;
        // If m_provider is a BIP32PubkeyProvider, we may get a string formatted like a OriginPubkeyProvider
        // In that case, we need to strip out the leading square bracket and fingerprint from the substring,
        // and append that to our own origin string.
        if (sub[0] == '[') {
            sub = sub.substr(9);
            ret = "[" + OriginString(StringType::PUBLIC, /*normalized=*/true) + std::move(sub);
        } else {
            ret = "[" + OriginString(StringType::PUBLIC, /*normalized=*/true) + "]" + std::move(sub);
        }
        return true;
    }